

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_fillreadbuffer(Curl_easy *data,size_t bytes,size_t *nreadp)

{
  dynbuf *pdVar1;
  char **ppcVar2;
  undefined1 *puVar3;
  int *piVar4;
  ushort uVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  CURLcode CVar10;
  size_t sVar11;
  size_t sVar12;
  trailers_state tVar13;
  long lVar14;
  char *pcVar15;
  Curl_easy *pCVar16;
  size_t sVar17;
  size_t sVar18;
  code *pcVar19;
  Curl_easy *data_1;
  size_t __n;
  curl_slist *trailers;
  trailers_state local_3c;
  char *local_38;
  
  tVar13 = (data->state).trailers_state;
  if (tVar13 == TRAILERS_INITIALIZED) {
    trailers._0_7_ = 0;
    stack0xffffffffffffffbf = stack0xffffffffffffffbf & 0xffffff00;
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"Moving trailers state machine from initialized to sending.");
    }
    (data->state).trailers_state = TRAILERS_SENDING;
    pdVar1 = &(data->state).trailers_buf;
    Curl_dyn_init(pdVar1,0x10000);
    (data->state).trailers_bytes_sent = 0;
    Curl_set_in_callback(data,true);
    iVar9 = (*(data->set).trailer_callback)(&trailers,(data->set).trailer_data);
    Curl_set_in_callback(data,false);
    if (iVar9 != 0) {
      Curl_failf(data,"operation aborted by trailing headers callback");
      *nreadp = 0;
      CVar10 = CURLE_ABORTED_BY_CALLBACK;
LAB_004fd33c:
      Curl_dyn_free(pdVar1);
      curl_slist_free_all((curl_slist *)CONCAT17(trailers._7_1_,trailers._0_7_));
      return CVar10;
    }
    CVar10 = Curl_http_compile_trailers
                       ((curl_slist *)CONCAT17(trailers._7_1_,trailers._0_7_),pdVar1,data);
    if (CVar10 != CURLE_OK) goto LAB_004fd33c;
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"Successfully compiled trailers.");
    }
    curl_slist_free_all((curl_slist *)CONCAT17(trailers._7_1_,trailers._0_7_));
    tVar13 = (data->state).trailers_state;
  }
  uVar5 = *(ushort *)&(data->req).field_0xbb;
  if ((tVar13 == TRAILERS_NONE & (byte)(uVar5 >> 9)) == 1) {
    bytes = bytes - 0xc;
    ppcVar2 = &(data->req).upload_fromhere;
    *ppcVar2 = *ppcVar2 + 10;
LAB_004fd3bd:
    pcVar19 = (data->state).fread_func;
    lVar14 = 0;
    pCVar16 = (Curl_easy *)(data->state).in;
  }
  else {
    if (tVar13 != TRAILERS_SENDING) goto LAB_004fd3bd;
    lVar14 = 1;
    pcVar19 = trailers_read;
    pCVar16 = data;
  }
  if ((data->req).fread_eof[lVar14] == '\0') {
    Curl_set_in_callback(data,true);
    sVar18 = (*pcVar19)((data->req).upload_fromhere,1,bytes,pCVar16);
    Curl_set_in_callback(data,false);
    (data->req).fread_eof[lVar14] = sVar18 == 0;
    if (sVar18 == 0x10000001) {
      if ((data->conn->handler->flags & 0x10) == 0) {
        piVar4 = &(data->req).keepon;
        *(byte *)piVar4 = (byte)*piVar4 | 0x20;
        if (((data->req).field_0xbc & 2) != 0) {
          ppcVar2 = &(data->req).upload_fromhere;
          *ppcVar2 = *ppcVar2 + -10;
        }
        *nreadp = 0;
        return CURLE_OK;
      }
      pcVar15 = "Read callback asked for PAUSE when not supported";
LAB_004fd688:
      Curl_failf(data,pcVar15);
      return CURLE_READ_ERROR;
    }
    if (sVar18 == 0x10000000) {
      Curl_failf(data,"operation aborted by callback");
      *nreadp = 0;
      return CURLE_ABORTED_BY_CALLBACK;
    }
    if (bytes < sVar18) {
      *nreadp = 0;
      pcVar15 = "read function returned funny value";
      goto LAB_004fd688;
    }
    uVar5 = *(ushort *)&(data->req).field_0xbb;
  }
  else {
    sVar18 = 0;
  }
  if ((uVar5 & 0xa00) != 0x200) goto LAB_004fd5da;
  if (((data->state).field_0x74d & 0x40) == 0) {
    local_38 = "\n";
    if (((data->set).field_0x8ba & 0x10) == 0) {
      local_38 = "\r\n";
    }
  }
  else {
    local_38 = "\n";
  }
  local_3c = (data->state).trailers_state;
  bVar7 = local_3c != TRAILERS_SENDING;
  if (local_3c == TRAILERS_SENDING) {
    __n = 0;
LAB_004fd539:
    pdVar1 = &(data->state).trailers_buf;
    sVar12 = Curl_dyn_len(pdVar1);
    sVar17 = sVar18;
    bVar8 = bVar7;
    if (sVar12 != (data->state).trailers_bytes_sent) goto LAB_004fd593;
    Curl_dyn_free(pdVar1);
    (data->state).trailers_state = TRAILERS_DONE;
    (data->set).trailer_data = (void *)0x0;
    (data->set).trailer_callback = (curl_trailer_callback)0x0;
    puVar3 = &(data->req).field_0xbb;
    *puVar3 = *puVar3 | 0x10;
    if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_004fd5c8;
    Curl_infof(data,"Signaling end of chunked upload after trailers.");
    if (local_3c == TRAILERS_SENDING) goto LAB_004fd5da;
  }
  else {
    trailers._0_7_ = 0;
    stack0xffffffffffffffbf = 0;
    iVar9 = curl_msnprintf((char *)&trailers,0xb,"%zx%s",sVar18);
    __n = (size_t)iVar9;
    pcVar15 = (data->req).upload_fromhere + -__n;
    (data->req).upload_fromhere = pcVar15;
    sVar17 = __n + sVar18;
    memcpy(pcVar15,&trailers,__n);
    pcVar15 = local_38;
    if (((sVar18 == 0) && ((data->set).trailer_callback != (curl_trailer_callback)0x0)) &&
       ((data->state).trailers_state == TRAILERS_NONE)) {
      (data->state).trailers_state = TRAILERS_INITIALIZED;
      bVar8 = false;
    }
    else {
      pcVar6 = (data->req).upload_fromhere;
      sVar11 = strlen(local_38);
      memcpy(pcVar6 + sVar17,pcVar15,sVar11);
      sVar18 = sVar17;
      bVar8 = true;
      if ((data->state).trailers_state == TRAILERS_SENDING) goto LAB_004fd539;
    }
LAB_004fd593:
    bVar7 = bVar8;
    sVar18 = sVar17;
    if (((sVar17 == __n) && (sVar18 = __n, (data->state).trailers_state != TRAILERS_INITIALIZED)) &&
       (puVar3 = &(data->req).field_0xbb, *puVar3 = *puVar3 | 0x10,
       ((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Signaling end of chunked upload via terminating chunk.");
    }
LAB_004fd5c8:
    if (!bVar7) goto LAB_004fd5da;
  }
  sVar11 = strlen(local_38);
  sVar18 = sVar18 + sVar11;
LAB_004fd5da:
  *nreadp = sVar18;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct Curl_easy *data, size_t bytes,
                             size_t *nreadp)
{
  size_t buffersize = bytes;
  size_t nread;
  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;
  int eof_index = 0;

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    struct curl_slist *trailers = NULL;
    CURLcode result;
    int trailers_ret_code;

    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.");
    data->state.trailers_state = TRAILERS_SENDING;
    Curl_dyn_init(&data->state.trailers_buf, DYN_TRAILERS);

    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      result = Curl_http_compile_trailers(trailers, &data->state.trailers_buf,
                                          data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      result = CURLE_ABORTED_BY_CALLBACK;
    }
    if(result) {
      Curl_dyn_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return result;
    }
    infof(data, "Successfully compiled trailers.");
    curl_slist_free_all(trailers);
  }
#endif

#ifndef CURL_DISABLE_HTTP
  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = trailers_read;
    extra_data = (void *)data;
    eof_index = 1;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  if(!data->req.fread_eof[eof_index]) {
    Curl_set_in_callback(data, true);
    nread = readfunc(data->req.upload_fromhere, 1, buffersize, extra_data);
    Curl_set_in_callback(data, false);
    /* make sure the callback is not called again after EOF */
    data->req.fread_eof[eof_index] = !nread;
  }
  else
    nread = 0;

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(data->conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

#ifndef CURL_DISABLE_HTTP
  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on state.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    bool added_crlf = FALSE;
    int hexlen = 0;
    const char *endofline_native;
    const char *endofline_network;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->state.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      char hexbuffer[11] = "";
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

    if(data->state.trailers_state == TRAILERS_SENDING &&
       !trailers_left(data)) {
      Curl_dyn_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.");
    }
    else
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#endif

  *nreadp = nread;

  return CURLE_OK;
}